

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O3

bool __thiscall
google::
dense_hashtable<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)'\n'>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)'\n'>_>::SetKey,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)'\n'>_>
::maybe_shrink(dense_hashtable<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__n_>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__n_>_>::SetKey,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__n_>_>
               *this)

{
  byte bVar1;
  byte min_buckets_wanted;
  bool bVar2;
  byte bVar3;
  dense_hashtable<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__n_>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__n_>_>::SetKey,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__n_>_>
  tmp;
  dense_hashtable<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__n_>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__n_>_>::SetKey,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__n_>_>
  local_60;
  
  bVar1 = (this->settings).super_sh_hashtable_settings<int,_Hasher,_unsigned_char,_4>.
          shrink_threshold_;
  if (((bVar1 == 0) || (bVar3 = this->num_elements - this->num_deleted, bVar1 <= bVar3)) ||
     (this->num_buckets < 0x21)) {
    bVar2 = false;
  }
  else {
    bVar1 = this->num_buckets;
    do {
      min_buckets_wanted = bVar1 >> 1;
      if (bVar1 < 0x42) break;
      bVar1 = min_buckets_wanted;
    } while ((float)bVar3 <
             (float)min_buckets_wanted *
             (this->settings).super_sh_hashtable_settings<int,_Hasher,_unsigned_char,_4>.
             shrink_factor_);
    dense_hashtable(&local_60,this,min_buckets_wanted);
    swap(this,&local_60);
    if (local_60.table != (pointer)0x0) {
      free(local_60.table);
    }
    bVar2 = true;
  }
  (this->settings).super_sh_hashtable_settings<int,_Hasher,_unsigned_char,_4>.consider_shrink_ =
       false;
  return bVar2;
}

Assistant:

bool maybe_shrink() {
    assert(num_elements >= num_deleted);
    assert((bucket_count() & (bucket_count() - 1)) == 0);  // is a power of two
    assert(bucket_count() >= HT_MIN_BUCKETS);
    bool retval = false;

    // If you construct a hashtable with < HT_DEFAULT_STARTING_BUCKETS,
    // we'll never shrink until you get relatively big, and we'll never
    // shrink below HT_DEFAULT_STARTING_BUCKETS.  Otherwise, something
    // like "dense_hash_set<int> x; x.insert(4); x.erase(4);" will
    // shrink us down to HT_MIN_BUCKETS buckets, which is too small.
    const size_type num_remain = num_elements - num_deleted;
    const size_type shrink_threshold = settings.shrink_threshold();
    if (shrink_threshold > 0 && num_remain < shrink_threshold &&
        bucket_count() > HT_DEFAULT_STARTING_BUCKETS) {
      const float shrink_factor = settings.shrink_factor();
      size_type sz = bucket_count() / 2;  // find how much we should shrink
      while (sz > HT_DEFAULT_STARTING_BUCKETS &&
             num_remain < sz * shrink_factor) {
        sz /= 2;  // stay a power of 2
      }
      dense_hashtable tmp(std::move(*this), sz);  // Do the actual resizing
      swap(tmp);                       // now we are tmp
      retval = true;
    }
    settings.set_consider_shrink(false);  // because we just considered it
    return retval;
  }